

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

bool __thiscall Jupiter::Timer::removeFromList(Timer *this)

{
  list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_> *plVar1;
  
  plVar1 = &o_timers_abi_cxx11_;
  do {
    plVar1 = (list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_> *)
             (plVar1->super__List_base<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>)._M_impl
             ._M_node.super__List_node_base._M_next;
    if (plVar1 == &o_timers_abi_cxx11_) goto LAB_0013908f;
  } while (*(Timer **)((long)plVar1 + 0x10) != this);
  o_timers_abi_cxx11_.super__List_base<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>._M_impl.
  _M_node._M_size =
       o_timers_abi_cxx11_.super__List_base<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>.
       _M_impl._M_node._M_size - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(plVar1,0x18);
LAB_0013908f:
  return plVar1 != &o_timers_abi_cxx11_;
}

Assistant:

bool Jupiter::Timer::removeFromList()
{
	for (auto node = o_timers.begin(); node != o_timers.end(); ++node)
	{
		if (*node == this)
		{
			o_timers.erase(node);
			return true;
		}
	}

	return false;
}